

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall
QHostInfoLookupManager::lookupFinished(QHostInfoLookupManager *this,QHostInfoRunnable *r)

{
  long lVar1;
  parameter_type in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  QMutexLocker<QMutex> locker;
  QHostInfoLookupManager *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (QMutex *)in_RDI);
  bVar2 = (in_RDI[2].resultEmitter.field_0x8 & 1) == 0;
  if (bVar2) {
    QList<QHostInfoRunnable*>::removeOne<QHostInfoRunnable*>
              ((QList<QHostInfoRunnable_*> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (QHostInfoRunnable **)in_RDI);
    QList<QHostInfoRunnable_*>::append((QList<QHostInfoRunnable_*> *)0x21ef40,in_RDI);
    rescheduleWithMutexHeld(in_stack_00000088);
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)(ulong)CONCAT14(!bVar2,in_stack_ffffffffffffffd0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoLookupManager::lookupFinished(QHostInfoRunnable *r)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

#if QT_CONFIG(thread)
    currentLookups.removeOne(r);
#endif
    finishedLookups.append(r);
    rescheduleWithMutexHeld();
}